

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O3

curi_status
parse_segment(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData,
             int notEmpty)

{
  size_t sVar1;
  _func_int_void_ptr_char_ptr_size_t *callback;
  size_t sVar2;
  curi_status cVar3;
  int iVar4;
  size_t sVar5;
  void *userData_00;
  size_t local_48;
  void *local_40;
  curi_settings *local_38;
  
  sVar1 = *offset;
  sVar5 = sVar1;
  userData_00 = userData;
  local_38 = settings;
  if (notEmpty != 0) {
    cVar3 = parse_pchar(uri,len,offset,settings,userData);
    if (cVar3 != curi_status_success) {
      return cVar3;
    }
    sVar5 = *offset;
  }
  local_48 = sVar5;
  local_40 = userData;
  cVar3 = parse_pchar(uri,len,&local_48,settings,userData_00);
  sVar2 = local_48;
  while (local_48 = sVar2, cVar3 == curi_status_success) {
    *offset = sVar2;
    cVar3 = parse_pchar(uri,len,&local_48,settings,userData_00);
    sVar5 = sVar2;
    sVar2 = local_48;
  }
  callback = local_38->path_segment_callback;
  if (local_38->url_decode == 0) {
    cVar3 = curi_status_success;
    if (callback != (_func_int_void_ptr_char_ptr_size_t *)0x0 && sVar5 != sVar1) {
      iVar4 = (*callback)(local_40,uri + sVar1,sVar5 - sVar1);
      cVar3 = (curi_status)(iVar4 == 0);
    }
    return cVar3;
  }
  cVar3 = handle_str_callback_url_decoded(callback,uri + sVar1,sVar5 - sVar1,local_38,local_40);
  return cVar3;
}

Assistant:

static curi_status parse_segment(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData, int notEmpty)
{
    // segment = pchars
    // segment-not-empty = pchar pchars
    const size_t initialOffset = *offset;
    curi_status status = curi_status_success;

    if (notEmpty && status == curi_status_success)
        status = parse_pchar(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_pchars(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = handle_path_segment(uri + initialOffset, *offset - initialOffset, settings, userData);

    return status;
}